

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeBinaryWithEqualEffectlessChildren
          (OptimizeInstructions *this,Binary *binary)

{
  Expression *pEVar1;
  Module *wasm;
  Type type;
  
  switch(binary->op) {
  case SubInt32:
  case XorInt32:
  case SubInt64:
  case XorInt64:
    type.id = (binary->left->type).id;
    wasm = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
    break;
  default:
    return (Expression *)0x0;
  case AndInt32:
  case OrInt32:
  case AndInt64:
  case OrInt64:
    return binary->left;
  case EqInt32:
  case LeSInt32:
  case LeUInt32:
  case GeSInt32:
  case GeUInt32:
  case EqInt64:
  case LeSInt64:
  case LeUInt64:
  case GeSInt64:
  case GeUInt64:
    pEVar1 = LiteralUtils::makeFromInt32
                       (1,(Type)0x2,
                        (this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .currModule);
    return pEVar1;
  case NeInt32:
  case LtSInt32:
  case LtUInt32:
  case GtSInt32:
  case GtUInt32:
  case NeInt64:
  case LtSInt64:
  case LtUInt64:
  case GtSInt64:
  case GtUInt64:
    wasm = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
    type.id = 2;
  }
  pEVar1 = LiteralUtils::makeZero(type,wasm);
  return pEVar1;
}

Assistant:

Expression* optimizeBinaryWithEqualEffectlessChildren(Binary* binary) {
    // TODO add: perhaps worth doing 2*x if x is quite large?
    switch (binary->op) {
      case SubInt32:
      case XorInt32:
      case SubInt64:
      case XorInt64:
        return LiteralUtils::makeZero(binary->left->type, *getModule());
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case GtSInt32:
      case GtUInt32:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case GtSInt64:
      case GtUInt64:
        return LiteralUtils::makeZero(Type::i32, *getModule());
      case AndInt32:
      case OrInt32:
      case AndInt64:
      case OrInt64:
        return binary->left;
      case EqInt32:
      case LeSInt32:
      case LeUInt32:
      case GeSInt32:
      case GeUInt32:
      case EqInt64:
      case LeSInt64:
      case LeUInt64:
      case GeSInt64:
      case GeUInt64:
        return LiteralUtils::makeFromInt32(1, Type::i32, *getModule());
      default:
        return nullptr;
    }
  }